

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

void __thiscall LEFReader::error(LEFReader *this,string *errstr)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(errstr->_M_dataplus)._M_p,errstr->_M_string_length);
  return;
}

Assistant:

void LEFReader::error(const std::string &errstr)
{
    std::cerr << "Line " << m_lineNum << " : " << errstr; 
}